

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderStart(Fts3Table *p,Fts3MultiSegReader *pCsr,char *zTerm,int nTerm)

{
  int nSegment;
  Fts3SegReader *pReader;
  int iVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar2;
  long lVar3;
  
  nSegment = pCsr->nSegment;
  lVar3 = 0;
  pcVar2 = zTerm;
  do {
    if ((pCsr->bRestart != 0) || (pCsr->nSegment <= lVar3)) {
      fts3SegReaderSort(pCsr->apSegment,nSegment,nSegment,fts3SegReaderCmp);
      return 0;
    }
    pReader = pCsr->apSegment[lVar3];
    do {
      iVar1 = fts3SegReaderNext(p,pReader,(int)pcVar2);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (zTerm == (char *)0x0) {
        iVar1 = 0;
        pcVar2 = extraout_RDX;
        break;
      }
      iVar1 = fts3SegReaderTermCmp(pReader,zTerm,nTerm);
      pcVar2 = extraout_RDX_00;
    } while (iVar1 < 0);
    if ((iVar1 != 0) && (pReader->bLookup != '\0')) {
      fts3SegReaderSetEof(pReader);
      pcVar2 = extraout_RDX_01;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int fts3SegReaderStart(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr,       /* Cursor object */
  const char *zTerm,              /* Term searched for (or NULL) */
  int nTerm                       /* Length of zTerm in bytes */
){
  int i;
  int nSeg = pCsr->nSegment;

  /* If the Fts3SegFilter defines a specific term (or term prefix) to search 
  ** for, then advance each segment iterator until it points to a term of
  ** equal or greater value than the specified term. This prevents many
  ** unnecessary merge/sort operations for the case where single segment
  ** b-tree leaf nodes contain more than one term.
  */
  for(i=0; pCsr->bRestart==0 && i<pCsr->nSegment; i++){
    int res = 0;
    Fts3SegReader *pSeg = pCsr->apSegment[i];
    do {
      int rc = fts3SegReaderNext(p, pSeg, 0);
      if( rc!=SQLITE_OK ) return rc;
    }while( zTerm && (res = fts3SegReaderTermCmp(pSeg, zTerm, nTerm))<0 );

    if( pSeg->bLookup && res!=0 ){
      fts3SegReaderSetEof(pSeg);
    }
  }
  fts3SegReaderSort(pCsr->apSegment, nSeg, nSeg, fts3SegReaderCmp);

  return SQLITE_OK;
}